

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator=
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  const_iterator first;
  const_iterator last;
  const_iterator local_30;
  
  if (this != other) {
    clear(this);
    begin(&local_30,other);
    first.it_.m_ = local_30.it_.m_;
    first.it_.node_ = local_30.it_.node_;
    first.it_.bucket_index_ = local_30.it_.bucket_index_;
    last.it_.bucket_index_ = 0;
    last.it_.node_ = (Node *)0x0;
    last.it_.m_ = (InnerMap *)0x0;
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
    insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
              ((Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *)this,first,last);
  }
  return this;
}

Assistant:

Map& operator=(const Map& other) {
    if (this != &other) {
      clear();
      insert(other.begin(), other.end());
    }
    return *this;
  }